

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O3

spv_result_t spvtools::val::NonUniformPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  uint uVar4;
  spv_result_t sVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Op OVar8;
  int32_t iVar9;
  GroupOperation GVar10;
  Instruction *pIVar11;
  char *pcVar12;
  long lVar13;
  string operand;
  char *local_220;
  long local_218;
  char local_210;
  undefined7 uStack_20f;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  OVar8 = (Op)uVar1;
  bVar3 = spvOpcodeIsNonUniformGroupOperation(OVar8);
  if (OVar8 + ~OpGroupNonUniformQuadAnyKHR < 0xfffffffe && bVar3) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar5 = ValidateExecutionScope(_,inst,uVar4);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
  }
  switch(OVar8) {
  case OpGroupNonUniformElect:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformElect(_,inst);
    return sVar5;
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar3 = ValidationState_t::IsBoolScalarType(_,uVar7);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Predicate must be a boolean scalar type";
      lVar13 = 0x27;
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a boolean scalar type";
      lVar13 = 0x24;
    }
    goto LAB_00195e63;
  case OpGroupNonUniformAllEqual:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformAllEqual(_,inst);
    return sVar5;
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
    uVar7 = (inst->inst_).type_id;
    bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar7);
    if (((!bVar3) && (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,uVar7), !bVar3)) &&
       (bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar7), !bVar3)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a scalar or vector of integer, floating-point, or boolean type";
      lVar13 = 0x4d;
      goto LAB_00195e63;
    }
    uVar6 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if (uVar6 == uVar7) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,4);
      bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar7);
      if (!bVar3) {
        uVar1 = (inst->inst_).opcode;
        local_220 = &local_210;
        local_218 = 0;
        local_210 = '\0';
        if (uVar1 < 0x15a) {
          if ((uVar1 == 0x151) || (uVar1 == 0x159)) {
            pcVar12 = "Id";
          }
          else {
LAB_00195ecb:
            pcVar12 = "Delta";
          }
        }
        else if (uVar1 == 0x15a) {
          pcVar12 = "Mask";
        }
        else if (uVar1 == 0x16d) {
          pcVar12 = "Index";
        }
        else {
          if (uVar1 != 0x16e) goto LAB_00195ecb;
          pcVar12 = "Direction";
        }
        std::__cxx11::string::_M_replace((ulong)&local_220,0,(char *)0x0,(ulong)pcVar12);
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_200,local_220,local_218);
        pcVar12 = " must be an unsigned integer scalar";
        lVar13 = 0x23;
        goto LAB_00195f1c;
      }
      uVar2 = (inst->inst_).opcode;
      if (uVar2 == 0x151) {
LAB_001958cb:
        if (0x104ff < _->version_) {
          return SPV_SUCCESS;
        }
      }
      else if (uVar2 != 0x16e) {
        if (uVar2 != 0x16d) {
          return SPV_SUCCESS;
        }
        goto LAB_001958cb;
      }
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
      OVar8 = ValidationState_t::GetIdOpcode(_,uVar4);
      iVar9 = spvOpcodeIsConstant(OVar8);
      if (iVar9 != 0) {
        return SPV_SUCCESS;
      }
      uVar1 = (inst->inst_).opcode;
      local_220 = &local_210;
      local_218 = 0;
      local_210 = '\0';
      if (uVar1 < 0x15a) {
        if ((uVar1 == 0x151) || (uVar1 == 0x159)) {
          pcVar12 = "Id";
        }
        else {
LAB_00195f92:
          pcVar12 = "Delta";
        }
      }
      else if (uVar1 == 0x15a) {
        pcVar12 = "Mask";
      }
      else if (uVar1 == 0x16d) {
        pcVar12 = "Index";
      }
      else {
        if (uVar1 != 0x16e) goto LAB_00195f92;
        pcVar12 = "Direction";
      }
      std::__cxx11::string::_M_replace((ulong)&local_220,0,(char *)0x0,(ulong)pcVar12);
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"Before SPIR-V 1.5, ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,local_220,local_218);
      pcVar12 = " must be a constant instruction";
      lVar13 = 0x1f;
LAB_00195f1c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar12,lVar13);
      DiagnosticStream::~DiagnosticStream(&local_200);
      if (local_220 == &local_210) {
        return local_200.error_;
      }
      operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
      return local_200.error_;
    }
    break;
  case OpGroupNonUniformBroadcastFirst:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformBroadcastFirst(_,inst);
    return sVar5;
  case OpGroupNonUniformBallot:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformBallot(_,inst);
    return sVar5;
  case OpGroupNonUniformInverseBallot:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformInverseBallot(_,inst);
    return sVar5;
  case OpGroupNonUniformBallotBitExtract:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformBallotBitExtract(_,inst);
    return sVar5;
  case OpGroupNonUniformBallotBitCount:
    sVar5 = anon_unknown_1::ValidateGroupNonUniformBallotBitCount(_,inst);
    return sVar5;
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(inst->inst_).type_id);
    if (!bVar3) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be an unsigned integer scalar";
LAB_00195caf:
      lVar13 = 0x29;
      goto LAB_00195e63;
    }
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,uVar7);
    if ((bVar3) && (uVar7 = ValidationState_t::GetDimension(_,uVar7), uVar7 == 4)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Value must be a 4-component unsigned integer vector";
LAB_00195c27:
    lVar13 = 0x33;
    goto LAB_00195e63;
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
    uVar1 = (inst->inst_).opcode;
    switch(uVar1) {
    case 0x15e:
    case 0x160:
    case 0x163:
switchD_00195800_caseD_15e:
      bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be a floating-point scalar or vector";
        lVar13 = 0x30;
        goto LAB_00195e63;
      }
      break;
    default:
      if ((uVar1 & 0xfffe) == 0x16a) {
LAB_0019596f:
        bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,(inst->inst_).type_id);
        if (!bVar3) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "Result must be a boolean scalar or vector";
          goto LAB_00195caf;
        }
        break;
      }
      if (uVar1 == 0x165) goto switchD_00195800_caseD_162;
      if (uVar1 == 0x16c) goto LAB_0019596f;
      if (uVar1 == 0x166) goto switchD_00195800_caseD_15e;
      bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(inst->inst_).type_id);
      if (bVar3) break;
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be an integer scalar or vector";
      goto LAB_00195de6;
    case 0x162:
switchD_00195800_caseD_162:
      bVar3 = ValidationState_t::IsUnsignedIntScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be an unsigned integer scalar or vector";
        goto LAB_00195c27;
      }
    }
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,4);
    if (uVar7 == (inst->inst_).type_id) {
      GVar10 = Instruction::GetOperandAs<spv::GroupOperation>(inst,3);
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x60) {
        if (GVar10 - GroupOperationPartitionedReduceNV < 3) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = 
          "Ballot must be present when Operation is PartitionedReduceNV, PartitionedInclusiveScanNV, or PartitionedExclusiveScanNV"
          ;
          lVar13 = 0x77;
        }
        else {
          if (GVar10 != ClusteredReduce) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "ClusterSize must be present when Operation is ClusteredReduce";
          lVar13 = 0x3d;
        }
      }
      else {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,5);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        if (GVar10 - GroupOperationPartitionedReduceNV < 3) {
          if (((pIVar11 != (Instruction *)0x0) &&
              (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(pIVar11->inst_).type_id), bVar3
              )) && (uVar7 = ValidationState_t::GetDimension(_,(pIVar11->inst_).type_id), uVar7 == 4
                    )) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "Ballot must be a 4-component integer vector";
          lVar13 = 0x2b;
        }
        else if ((pIVar11 == (Instruction *)0x0) ||
                (bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar11->inst_).type_id),
                !bVar3)) {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "ClusterSize must be an unsigned integer scalar";
          lVar13 = 0x2e;
        }
        else {
          iVar9 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode);
          if (iVar9 != 0) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "ClusterSize must be a constant instruction";
LAB_00195de6:
          lVar13 = 0x2a;
        }
      }
      goto LAB_00195e63;
    }
    break;
  default:
    if (uVar1 != 0x114f) {
      return SPV_SUCCESS;
    }
    sVar5 = anon_unknown_1::ValidateGroupNonUniformRotateKHR(_,inst);
    return sVar5;
  }
  ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar12 = "The type of Value must match the Result type";
  lVar13 = 0x2c;
LAB_00195e63:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar12,lVar13);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t NonUniformPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  if (spvOpcodeIsNonUniformGroupOperation(opcode)) {
    // OpGroupNonUniformQuadAllKHR and OpGroupNonUniformQuadAnyKHR don't have
    // scope paramter
    if ((opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
        (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) {
      const uint32_t execution_scope = inst->GetOperandAs<uint32_t>(2);
      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }
    }
  }

  switch (opcode) {
    case spv::Op::OpGroupNonUniformElect:
      return ValidateGroupNonUniformElect(_, inst);
    case spv::Op::OpGroupNonUniformAny:
    case spv::Op::OpGroupNonUniformAll:
      return ValidateGroupNonUniformAnyAll(_, inst);
    case spv::Op::OpGroupNonUniformAllEqual:
      return ValidateGroupNonUniformAllEqual(_, inst);
    case spv::Op::OpGroupNonUniformBroadcast:
    case spv::Op::OpGroupNonUniformShuffle:
    case spv::Op::OpGroupNonUniformShuffleXor:
    case spv::Op::OpGroupNonUniformShuffleUp:
    case spv::Op::OpGroupNonUniformShuffleDown:
    case spv::Op::OpGroupNonUniformQuadBroadcast:
    case spv::Op::OpGroupNonUniformQuadSwap:
      return ValidateGroupNonUniformBroadcastShuffle(_, inst);
    case spv::Op::OpGroupNonUniformBroadcastFirst:
      return ValidateGroupNonUniformBroadcastFirst(_, inst);
    case spv::Op::OpGroupNonUniformBallot:
      return ValidateGroupNonUniformBallot(_, inst);
    case spv::Op::OpGroupNonUniformInverseBallot:
      return ValidateGroupNonUniformInverseBallot(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitExtract:
      return ValidateGroupNonUniformBallotBitExtract(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitCount:
      return ValidateGroupNonUniformBallotBitCount(_, inst);
    case spv::Op::OpGroupNonUniformBallotFindLSB:
    case spv::Op::OpGroupNonUniformBallotFindMSB:
      return ValidateGroupNonUniformBallotFind(_, inst);
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return ValidateGroupNonUniformArithmetic(_, inst);
    case spv::Op::OpGroupNonUniformRotateKHR:
      return ValidateGroupNonUniformRotateKHR(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}